

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  exception_ptr local_38 [2];
  exception_ptr local_28;
  
  std::current_exception();
  local_28._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_28);
  std::__exception_ptr::exception_ptr::~exception_ptr(local_38);
  if (local_38[0]._M_exception_object == (void *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Non C++ exception. Possibly a CLR exception.",
               (allocator<char> *)local_38);
  }
  else {
    tryTranslators_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExceptionTranslatorRegistry::translateActiveException() const {
        try {
            // Compiling a mixed mode project with MSVC means that CLR
            // exceptions will be caught in (...) as well. However, these
            // do not fill-in std::current_exception and thus lead to crash
            // when attempting rethrow.
            // /EHa switch also causes structured exceptions to be caught
            // here, but they fill-in current_exception properly, so
            // at worst the output should be a little weird, instead of
            // causing a crash.
            if (std::current_exception() == nullptr) {
                return "Non C++ exception. Possibly a CLR exception.";
            }
            return tryTranslators();
        }
        catch (TestFailureException &) {
            std::rethrow_exception(std::current_exception());
        }
        catch (std::exception &ex) {
            return ex.what();
        }
        catch (std::string &msg) {
            return msg;
        }
        catch (const char *msg) {
            return msg;
        }
        catch (...) {
            return "Unknown exception";
        }
    }